

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

_Bool d2d_small_int(uint64_t ieeeMantissa,uint32_t ieeeExponent,floating_decimal_64 *v)

{
  int iVar1;
  uint64_t fraction;
  uint64_t mask;
  int32_t e2;
  uint64_t m2;
  floating_decimal_64 *v_local;
  uint32_t ieeeExponent_local;
  uint64_t ieeeMantissa_local;
  
  iVar1 = ieeeExponent - 0x433;
  if (iVar1 < 1) {
    if (iVar1 < -0x34) {
      ieeeMantissa_local._7_1_ = false;
    }
    else if (((ieeeMantissa | 0x10000000000000) & (1L << (-(char)iVar1 & 0x3fU)) - 1U) == 0) {
      v->mantissa = (ieeeMantissa | 0x10000000000000) >> (-(char)iVar1 & 0x3fU);
      v->exponent = 0;
      ieeeMantissa_local._7_1_ = true;
    }
    else {
      ieeeMantissa_local._7_1_ = false;
    }
  }
  else {
    ieeeMantissa_local._7_1_ = false;
  }
  return ieeeMantissa_local._7_1_;
}

Assistant:

static inline bool d2d_small_int(const uint64_t ieeeMantissa, const uint32_t ieeeExponent,
				 floating_decimal_64* const v) {
	const uint64_t m2 = (1ull << DOUBLE_MANTISSA_BITS) | ieeeMantissa;
	const int32_t e2 = (int32_t) ieeeExponent - DOUBLE_BIAS - DOUBLE_MANTISSA_BITS;

	if (e2 > 0) {
		// f = m2 * 2^e2 >= 2^53 is an integer.
		// Ignore this case for now.
		return false;
	}

	if (e2 < -52) {
		// f < 1.
		return false;
	}

	// Since 2^52 <= m2 < 2^53 and 0 <= -e2 <= 52: 1 <= f = m2 / 2^-e2 < 2^53.
	// Test if the lower -e2 bits of the significand are 0, i.e. whether the fraction is 0.
	const uint64_t mask = (1ull << -e2) - 1;
	const uint64_t fraction = m2 & mask;
	if (fraction != 0) {
		return false;
	}

	// f is an integer in the range [1, 2^53).
	// Note: mantissa might contain trailing (decimal) 0's.
	// Note: since 2^53 < 10^16, there is no need to adjust decimalLength17().
	v->mantissa = m2 >> -e2;
	v->exponent = 0;
	return true;
}